

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtAudio::RtAudio(RtAudio *this,Api api,RtAudioErrorCallback *errorCallback)

{
  RtApi *pRVar1;
  bool bVar2;
  pointer pAVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  string errorMessage;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> apis;
  char local_d1;
  RtAudioErrorCallback *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> local_a8;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->rtapi_ = (RtApi *)0x0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (api != UNSPECIFIED) {
    openRtApi(this,api);
    pRVar1 = this->rtapi_;
    if (pRVar1 != (RtApi *)0x0) {
      if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_68,errorCallback);
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator=(&pRVar1->errorCallback_,
                    (function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
      }
      goto LAB_0010a5c3;
    }
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x115300);
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_a8,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_a8.
                             super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_a8.
                             super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,8);
      (*errorCallback->_M_invoker)
                ((_Any_data *)errorCallback,(RtAudioErrorType *)&local_a8,&local_c8);
    }
  }
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = errorCallback;
  getCompiledApi(&local_a8);
  pAVar3 = local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      openRtApi(this,pAVar3[uVar4]);
      if (this->rtapi_ == (RtApi *)0x0) {
        bVar8 = true;
      }
      else {
        RtApi::getDeviceNames_abi_cxx11_(&local_48,this->rtapi_);
        bVar8 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      bVar2 = uVar6 < (ulong)(lVar7 >> 2);
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while ((bool)(bVar8 & bVar2));
  }
  pRVar1 = this->rtapi_;
  if (pRVar1 == (RtApi *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&local_c8,"RtAudio: no compiled API support found ... critical error!");
    if ((local_d0->super__Function_base)._M_manager == (_Manager_type)0x0) {
      local_d1 = '\n';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_d1,1)
      ;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      local_d1 = '\n';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_d1,1);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(local_d0,RTAUDIO_INVALID_USE,&local_c8);
    }
    abort();
  }
  if ((local_d0->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_88,local_d0);
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&pRVar1->errorCallback_,
                (function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
  }
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3);
  }
LAB_0010a5c3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

RtAudio :: RtAudio( RtAudio::Api api, RtAudioErrorCallback&& errorCallback )
{
  rtapi_ = 0;

  std::string errorMessage;
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openRtApi( api );

    if ( rtapi_ ) {
      if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
      return;
    }

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    errorMessage = "RtAudio: no compiled support for specified API argument!";
    if ( errorCallback )
      errorCallback( RTAUDIO_INVALID_USE, errorMessage );
    else
      std::cerr << '\n' << errorMessage << '\n' << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one device or we reach the end of the list.
  std::vector< RtAudio::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openRtApi( apis[i] );
    if ( rtapi_ && (rtapi_->getDeviceNames()).size() > 0 )
      break;
  }

  if ( rtapi_ ) {
    if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
    return;
  }

  // It should not be possible to get here because the preprocessor
  // definition __RTAUDIO_DUMMY__ is automatically defined in RtAudio.h
  // if no API-specific definitions are passed to the compiler. But just
  // in case something weird happens, issue an error message and abort.
  errorMessage = "RtAudio: no compiled API support found ... critical error!";
  if ( errorCallback )
    errorCallback( RTAUDIO_INVALID_USE, errorMessage );
  else
    std::cerr << '\n' << errorMessage << '\n' << std::endl;
  abort();
}